

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::ChangeOwnershipInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ChangeOwnershipInfo *this)

{
  string *catalog;
  CatalogType type;
  string sStack_38;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b71df5 + 9,(allocator *)&sStack_38);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ParseInfo::TypeToString_abi_cxx11_
            (&sStack_38,(ParseInfo *)(ulong)(byte)(this->super_AlterInfo).field_0x71,type);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterInfo).super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  catalog = &(this->super_AlterInfo).catalog;
  ParseInfo::QualifierToString
            (&sStack_38,catalog,&(this->super_AlterInfo).schema,&(this->super_AlterInfo).name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ParseInfo::QualifierToString(&sStack_38,catalog,&this->owner_schema,&this->owner_name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ChangeOwnershipInfo::ToString() const {
	string result = "";

	result += "ALTER ";
	result += TypeToString(entry_catalog_type);
	result += " ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += "IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " OWNED BY ";
	result += QualifierToString(catalog, owner_schema, owner_name);
	result += ";";
	return result;
}